

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O3

void __thiscall
ktx::CommandCompare::compareKVD(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  CommandCompare *pCVar1;
  pointer pcVar2;
  void *pvVar3;
  Combine<ktx::OptionsFormat,_ktx::CommandCompare::OptionsCompare,_ktx::OptionsGeneric> *pCVar4;
  undefined1 *puVar5;
  _Rb_tree_node_base *p_Var6;
  int iVar7;
  long lVar8;
  CommandCompare **ppCVar9;
  iterator iVar10;
  CommandCompare *pCVar11;
  ulong uVar12;
  _Self __tmp;
  bool bVar13;
  _Self __tmp_1;
  ulong uVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  uint uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  bool bVar16;
  iterator it [2];
  ktxHashList kvDataHead;
  ktx_uint32_t keyLen;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
  keys [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> keyValueStores [2];
  char *key;
  CommandCompare *local_138 [3];
  _Rb_tree_node_base *local_120;
  PrintDiff *local_118;
  undefined1 local_110 [32];
  Reporter *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  long local_b8 [2];
  undefined1 local_a8 [40];
  char *local_80 [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_50;
  pointer local_38;
  
  if ((this->options).super_OptionsCompare.ignoreAllMetadata == false) {
    local_118 = diff;
    local_e8._M_allocated_capacity = (size_type)streams;
    local_d8._0_8_ = &local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"Key/Value Data\n\n","");
    this_00 = &local_118->context;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(this_00,(local_118->context).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,__args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._0_8_ != &local_c8) {
      operator_delete((void *)local_d8._0_8_,local_c8._M_allocated_capacity + 1);
    }
    vStack_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar8 = 0;
    do {
      *(undefined8 *)((long)&local_c8 + lVar8) = 0;
      *(undefined8 *)((long)local_b8 + lVar8 + -8) = 0;
      *(undefined8 *)(local_d8 + lVar8) = 0;
      *(undefined8 *)(local_d8 + lVar8 + 8) = 0;
      *(undefined1 **)((long)local_b8 + lVar8 + -8) = local_d8 + lVar8 + 8;
      *(undefined1 **)((long)local_b8 + lVar8) = local_d8 + lVar8 + 8;
      *(undefined8 *)((long)local_b8 + lVar8 + 8) = 0;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0x60);
    local_f0 = &(this->super_Command).super_Reporter;
    this_01 = &local_68;
    local_120 = (_Rb_tree_node_base *)
                CONCAT44(local_120._4_4_,(int)CONCAT71((int7)((ulong)local_f0 >> 8),1));
    lVar8 = 0;
    local_138[2] = this;
    do {
      uVar14 = (ulong)(local_138[2]->headers).
                      super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8].keyValueData.byteLength;
      if (uVar14 != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_01,uVar14);
        pCVar11 = local_138[2];
        args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (lVar8 * 0x3b8 + local_e8._M_allocated_capacity);
        local_80[1] = (char *)0x7;
        local_80[2] = "the KVD";
        read(local_138[2],(int)args_1,
             (void *)(ulong)(local_138[2]->headers).
                            super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar8].keyValueData.byteOffset,
             (size_t)(this_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start);
        local_110._0_8_ = (CommandCompare *)0x0;
        iVar7 = ktxHashList_Deserialize
                          (local_110,
                           (pCVar11->headers).
                           super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar8].keyValueData.byteLength,
                           (this_01->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start);
        if (iVar7 != 0) {
          Reporter::fatal<char_const(&)[34],std::__cxx11::string_const&>
                    (local_f0,DFD_FAILURE,(char (*) [34])"Failed to parse KVD in file \"{}\".",
                     args_1);
        }
        if ((CommandCompare *)local_110._0_8_ != (CommandCompare *)0x0) {
          local_138[0] = (CommandCompare *)local_110._0_8_;
          uVar15 = 0;
          do {
            ktxHashListEntry_GetKey(local_138[0],local_e8._M_local_buf + 0xc,&local_38);
            std::
            _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>>>
            ::_M_emplace_unique<char*&,ktxKVListEntry*&>
                      ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>>>
                        *)__args,(char **)&local_38,(ktxKVListEntry **)local_138);
            local_138[0] = (CommandCompare *)ktxHashList_Next(local_138[0]);
            if (local_138[0] == (CommandCompare *)0x0) break;
            bVar16 = uVar15 < 99;
            uVar15 = uVar15 + 1;
          } while (bVar16);
        }
      }
      lVar8 = 1;
      __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
      this_01 = &vStack_50;
      uVar14 = (ulong)local_120 & 1;
      local_120 = (_Rb_tree_node_base *)((ulong)local_120 & 0xffffffff00000000);
    } while (uVar14 != 0);
    local_138[0] = (CommandCompare *)local_c8._8_8_;
    local_138[1] = (CommandCompare *)local_a8._24_8_;
    if ((_Rb_tree_node_base *)local_a8._24_8_ != (_Rb_tree_node_base *)(local_a8 + 8) ||
        (CommandCompare *)local_c8._8_8_ != (CommandCompare *)(local_d8 + 8)) {
      pCVar4 = &local_138[2]->options;
      do {
        ppCVar9 = local_138;
        puVar5 = local_d8;
        lVar8 = 0;
        pCVar11 = local_138[0];
        bVar16 = true;
        local_138[2] = local_138[0];
        local_120 = (_Rb_tree_node_base *)local_138[1];
        do {
          bVar13 = bVar16;
          pCVar1 = *ppCVar9;
          if (pCVar1 != (CommandCompare *)(puVar5 + 8)) {
            pcVar2 = (pCVar1->super_Command).super_Reporter.commandDescription._M_dataplus._M_p;
            local_110._0_8_ = local_110 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_110,pcVar2,
                       pcVar2 + *(long *)((long)&(pCVar1->super_Command).super_Reporter.commandName.
                                                 field_2 + 8));
            iVar10 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find(&(pCVar4->super_OptionsCompare).ignoreMetadataKeys._M_h,
                            (key_type *)local_110);
            pCVar11 = (CommandCompare *)local_110._0_8_;
            if ((CommandCompare *)local_110._0_8_ != (CommandCompare *)(local_110 + 0x10)) {
              operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
            }
            if (iVar10.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              pCVar11 = (CommandCompare *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar1);
              local_138[lVar8] = pCVar11;
              goto LAB_0012dd68;
            }
          }
          p_Var6 = local_120;
          pCVar1 = local_138[2];
          lVar8 = 1;
          ppCVar9 = local_138 + 1;
          puVar5 = local_a8;
          bVar16 = false;
        } while (bVar13);
        if (local_138[2] == (CommandCompare *)(local_d8 + 8)) {
          if (local_120 == (_Rb_tree_node_base *)(local_a8 + 8)) {
LAB_0012dcd3:
            compareKVEntry(pCVar11,local_118,
                           (string_view *)
                           ((long)&(pCVar1->super_Command).super_Reporter.commandName.field_2 + 8),
                           (ktxHashListEntry *)
                           (pCVar1->super_Command).super_Reporter.commandDescription.
                           _M_string_length,(ktxHashListEntry *)p_Var6[1]._M_left);
            local_138[0] = (CommandCompare *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar1);
          }
          else {
LAB_0012dd47:
            compareKVEntry(pCVar11,local_118,(string_view *)(p_Var6 + 1),(ktxHashListEntry *)0x0,
                           (ktxHashListEntry *)p_Var6[1]._M_left);
          }
          local_138[1] = (CommandCompare *)std::_Rb_tree_increment(p_Var6);
        }
        else {
          if (local_120 != (_Rb_tree_node_base *)(local_a8 + 8)) {
            uVar14 = *(ulong *)((long)&(local_138[2]->super_Command).super_Reporter.commandName.
                                       field_2 + 8);
            uVar12 = *(ulong *)(local_120 + 1);
            lVar8 = uVar14 - uVar12;
            if (uVar14 < uVar12) {
              uVar12 = uVar14;
            }
            if (uVar12 == 0) {
LAB_0012dc52:
              if (lVar8 < -0x7fffffff) {
                lVar8 = -0x80000000;
              }
              if (0x7ffffffe < lVar8) {
                lVar8 = 0x7fffffff;
              }
              iVar7 = (int)lVar8;
            }
            else {
              pCVar11 = (CommandCompare *)
                        (local_138[2]->super_Command).super_Reporter.commandDescription._M_dataplus.
                        _M_p;
              iVar7 = memcmp(pCVar11,local_120[1]._M_parent,uVar12);
              if (iVar7 == 0) goto LAB_0012dc52;
            }
            if (-1 < iVar7) {
              if (p_Var6 == (_Rb_tree_node_base *)(local_a8 + 8)) goto LAB_0012dcd3;
              uVar14 = *(ulong *)((long)&(pCVar1->super_Command).super_Reporter.commandName.field_2
                                 + 8);
              uVar12 = *(ulong *)(p_Var6 + 1);
              lVar8 = uVar14 - uVar12;
              if (uVar14 < uVar12) {
                uVar12 = uVar14;
              }
              if (uVar12 == 0) {
LAB_0012dcaf:
                if (lVar8 < -0x7fffffff) {
                  lVar8 = -0x80000000;
                }
                if (0x7ffffffe < lVar8) {
                  lVar8 = 0x7fffffff;
                }
                iVar7 = (int)lVar8;
              }
              else {
                pCVar11 = (CommandCompare *)
                          (pCVar1->super_Command).super_Reporter.commandDescription._M_dataplus._M_p
                ;
                iVar7 = memcmp(pCVar11,p_Var6[1]._M_parent,uVar12);
                if (iVar7 == 0) goto LAB_0012dcaf;
              }
              if (0 < iVar7) goto LAB_0012dd47;
              goto LAB_0012dcd3;
            }
          }
          compareKVEntry(pCVar11,local_118,
                         (string_view *)
                         ((long)&(pCVar1->super_Command).super_Reporter.commandName.field_2 + 8),
                         (ktxHashListEntry *)
                         (pCVar1->super_Command).super_Reporter.commandDescription._M_string_length,
                         (ktxHashListEntry *)0x0);
          local_138[0] = (CommandCompare *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar1);
        }
LAB_0012dd68:
      } while (local_138[1] != (CommandCompare *)(local_a8 + 8) ||
               local_138[0] != (CommandCompare *)(local_d8 + 8));
    }
    lVar8 = 0x30;
    do {
      std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                   *)(local_d8 + lVar8));
      lVar8 = lVar8 + -0x30;
    } while (lVar8 != -0x30);
    lVar8 = 0x30;
    do {
      pvVar3 = *(void **)((long)local_80 + lVar8);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,*(long *)((long)local_80 + lVar8 + 0x10) - (long)pvVar3);
      }
      lVar8 = lVar8 + -0x18;
    } while (lVar8 != 0);
  }
  return;
}

Assistant:

void CommandCompare::compareKVD(PrintDiff& diff, InputStreams& streams) {
    if (options.ignoreAllMetadata) return;

    diff.setContext("Key/Value Data\n\n");

    std::vector<uint8_t> keyValueStores[2] = {};
    std::map<std::string_view, ktxHashListEntry*> keys[2] = {};

    for (std::size_t i = 0; i < streams.size(); ++i) {
        if (headers[i].keyValueData.byteLength == 0) continue;

        keyValueStores[i].resize(headers[i].keyValueData.byteLength);
        read(streams[i], headers[i].keyValueData.byteOffset, keyValueStores[i].data(),
            headers[i].keyValueData.byteLength, "the KVD");

        ktxHashList kvDataHead = nullptr;
        KTX_error_code result = ktxHashList_Deserialize(&kvDataHead,
            headers[i].keyValueData.byteLength, keyValueStores[i].data());
        if (result != KTX_SUCCESS)
            fatal(rc::KTX_FAILURE, "Failed to parse KVD in file \"{}\".", streams[i].str());

        if (kvDataHead == nullptr)
            continue;

        uint32_t entryIndex = 0;
        ktxHashListEntry* entry = kvDataHead;
        for (; entry != NULL && entryIndex < MAX_NUM_KV_ENTRIES; entry = ktxHashList_Next(entry), ++entryIndex) {
            char* key;
            ktx_uint32_t keyLen;
            ktxHashListEntry_GetKey(entry, &keyLen, &key);
            keys[i].emplace(key, entry);
        }
    }

    std::map<std::string_view, ktxHashListEntry*>::iterator it[2] = { keys[0].begin(), keys[1].begin() };
    while (it[0] != keys[0].end() || it[1] != keys[1].end()) {
        bool ignoreKey = false;
        for (std::size_t i = 0; i < streams.size(); ++i)
            if ((it[i] != keys[i].end()) &&
                (options.ignoreMetadataKeys.find(std::string(it[i]->first)) != options.ignoreMetadataKeys.end())) {
                // Key is on the ignore list, skip it
                it[i]++;
                ignoreKey = true;
                break;
            }
        if (ignoreKey) continue;

        if ((it[0] != keys[0].end()) && ((it[1] == keys[1].end()) || (it[0]->first < it[1]->first))) {
            // First stream has a key that is not present in the second stream
            compareKVEntry(diff, it[0]->first, it[0]->second, nullptr);
            it[0]++;
        } else if ((it[1] != keys[1].end()) && ((it[0] == keys[0].end()) || (it[0]->first > it[1]->first))) {
            // Second stream has a key that is not present in the first stream
            compareKVEntry(diff, it[1]->first, nullptr, it[1]->second);
            it[1]++;
        } else {
            // Both streams have the key
            compareKVEntry(diff, it[0]->first, it[0]->second, it[1]->second);
            it[0]++;
            it[1]++;
        }
    }
}